

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

int nni_url_parse_inline_inner(nng_url *url,char *raw)

{
  char cVar1;
  uint16_t uVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  char *pcVar6;
  bool bVar7;
  int local_54;
  int i_1;
  char *at;
  int i;
  int rv;
  char c;
  char *p;
  char *s;
  size_t len;
  char *raw_local;
  nng_url *url_local;
  
  for (s = (char *)0x0; (raw[(long)s] != ':' && (raw[(long)s] != '\0')); s = s + 1) {
  }
  iVar3 = strncmp(raw + (long)s,"://",3);
  if (iVar3 == 0) {
    for (at._4_4_ = 0; nni_schemes[at._4_4_] != (char *)0x0; at._4_4_ = at._4_4_ + 1) {
      iVar3 = strncmp(raw,nni_schemes[at._4_4_],(size_t)s);
      if (iVar3 == 0) {
        url->u_scheme = nni_schemes[at._4_4_];
        break;
      }
    }
    if (url->u_scheme == (char *)0x0) {
      url_local._4_4_ = 9;
    }
    else {
      pcVar4 = s + (long)raw;
      sVar5 = strlen(pcVar4);
      if (sVar5 < 0x80) {
        snprintf(url->u_static,0x80,"%s",pcVar4);
        url->u_buffer = url->u_static;
        url->u_bufsz = 0;
      }
      else {
        pcVar6 = nni_strdup(pcVar4);
        url->u_buffer = pcVar6;
        sVar5 = strlen(pcVar4);
        url->u_bufsz = sVar5 + 1;
      }
      pcVar4 = url->u_buffer + 3;
      iVar3 = strcmp(url->u_scheme,"ipc");
      if ((((iVar3 == 0) || (iVar3 = strcmp(url->u_scheme,"unix"), iVar3 == 0)) ||
          (iVar3 = strcmp(url->u_scheme,"abstract"), iVar3 == 0)) ||
         ((iVar3 = strcmp(url->u_scheme,"inproc"), iVar3 == 0 ||
          (iVar3 = strcmp(url->u_scheme,"socket"), _rv = pcVar4, iVar3 == 0)))) {
        url->u_path = pcVar4;
        url->u_hostname = (char *)0x0;
        url->u_query = (char *)0x0;
        url->u_fragment = (char *)0x0;
        url->u_userinfo = (char *)0x0;
        url_local._4_4_ = 0;
      }
      else {
        for (; ((cVar1 = *_rv, cVar1 != '\0' && (cVar1 != '/')) &&
               ((cVar1 != '#' && (cVar1 != '?')))); _rv = _rv + 1) {
        }
        *_rv = '\0';
        pcVar6 = url->u_buffer;
        sVar5 = strlen(pcVar4);
        memmove(pcVar6,pcVar4,sVar5 + 1);
        *_rv = cVar1;
        url->u_path = _rv;
        url->u_hostname = url->u_buffer;
        pcVar4 = strchr(url->u_hostname,0x40);
        if (pcVar4 != (char *)0x0) {
          url->u_userinfo = url->u_hostname;
          *pcVar4 = '\0';
          url->u_hostname = pcVar4 + 1;
          pcVar4 = strchr(url->u_hostname,0x40);
          if (pcVar4 != (char *)0x0) {
            return 3;
          }
        }
        for (local_54 = 0; url->u_hostname[local_54] != '\0'; local_54 = local_54 + 1) {
          iVar3 = tolower((int)url->u_hostname[local_54]);
          url->u_hostname[local_54] = (char)iVar3;
        }
        url_local._4_4_ = nni_url_canonify_uri(_rv);
        if (url_local._4_4_ == 0) {
          for (; ((cVar1 = *_rv, cVar1 != '\0' && (cVar1 != '?')) && (cVar1 != '#')); _rv = _rv + 1)
          {
          }
          if (*_rv == '?') {
            *_rv = '\0';
            url->u_query = _rv + 1;
            for (_rv = _rv + 1; *_rv != '\0'; _rv = _rv + 1) {
              if (*_rv == '#') {
                *_rv = '\0';
                url->u_fragment = _rv + 1;
                break;
              }
            }
          }
          else if (cVar1 == '#') {
            *_rv = '\0';
            url->u_fragment = _rv + 1;
          }
          _rv = url->u_hostname;
          if (*_rv == '[') {
            url->u_hostname = url->u_hostname + 1;
            pcVar4 = _rv;
            do {
              _rv = pcVar4 + 1;
              if (*_rv == ']') {
                pcVar4 = pcVar4 + 2;
                *_rv = '\0';
                _rv = pcVar4;
                if ((*pcVar4 != ':') && (*pcVar4 != '\0')) {
                  return 3;
                }
                goto LAB_00120c67;
              }
              pcVar4 = _rv;
            } while (*_rv != '\0');
            url_local._4_4_ = 3;
          }
          else {
            while( true ) {
              bVar7 = false;
              if (*_rv != ':') {
                bVar7 = *_rv != '\0';
              }
              if (!bVar7) break;
              _rv = _rv + 1;
            }
LAB_00120c67:
            cVar1 = *_rv;
            if (cVar1 == ':') {
              *_rv = '\0';
              _rv = _rv + 1;
            }
            sVar5 = strlen(url->u_hostname);
            if (sVar5 < 0x100) {
              if (cVar1 == ':') {
                if (*_rv == '\0') {
                  return 3;
                }
                iVar3 = nni_get_port_by_name(_rv,&url->u_port);
                if (iVar3 != 0) {
                  return 3;
                }
              }
              else {
                uVar2 = nni_url_default_port(url->u_scheme);
                url->u_port = (uint)uVar2;
              }
              url_local._4_4_ = 0;
            }
            else {
              url_local._4_4_ = 3;
            }
          }
        }
      }
    }
  }
  else {
    url_local._4_4_ = 3;
  }
  return url_local._4_4_;
}

Assistant:

static int
nni_url_parse_inline_inner(nng_url *url, const char *raw)
{
	size_t      len;
	const char *s;
	char       *p;
	char        c;
	int         rv;

	// Grab the scheme.
	s = raw;
	for (len = 0; (c = s[len]) != ':'; len++) {
		if (c == 0) {
			break;
		}
	}
	if (strncmp(s + len, "://", 3) != 0) {
		return (NNG_EINVAL);
	}

	for (int i = 0; nni_schemes[i] != NULL; i++) {
		if (strncmp(s, nni_schemes[i], len) == 0) {
			url->u_scheme = nni_schemes[i];
			break;
		}
	}
	if (url->u_scheme == NULL) {
		return (NNG_ENOTSUP);
	}
	s += len;

	// A little tricky.  We copy the "://" here, even though we don't need
	// it. This affords us some space for zero bytes between URL components
	// if needed

	if (strlen(s) >= sizeof(url->u_static)) {
		url->u_buffer = nni_strdup(s);
		url->u_bufsz  = strlen(s) + 1;
	} else {
		snprintf(url->u_static, sizeof(url->u_static), "%s", s);
		url->u_buffer = url->u_static;
		url->u_bufsz  = 0;
	}

	p = url->u_buffer + strlen("://");
	s = p;

	// For compatibility reasons, we treat ipc:// and inproc:// paths
	// specially. These names URLs have a path name (ipc) or arbitrary
	// string (inproc) and don't include anything like a host.  Note that
	// in the case of path names, it is incumbent upon the application to
	// ensure that valid and safe path names are used.  Note also that
	// path names are not canonicalized, which means that the address and
	// URL properties for relative paths won't be portable to other
	// processes unless they are in the same directory.  When in doubt,
	// we recommend using absolute paths, such as ipc:///var/run/socket.

	if ((strcmp(url->u_scheme, "ipc") == 0) ||
	    (strcmp(url->u_scheme, "unix") == 0) ||
	    (strcmp(url->u_scheme, "abstract") == 0) ||
	    (strcmp(url->u_scheme, "inproc") == 0) ||
	    (strcmp(url->u_scheme, "socket") == 0)) {
		url->u_path     = p;
		url->u_hostname = NULL;
		url->u_query    = NULL;
		url->u_fragment = NULL;
		url->u_userinfo = NULL;
		return (0);
	}

	// Look for host part (including colon).  Will be terminated by
	// a path, or NUL.  May also include an "@", separating a user
	// field.
	for (;;) {
		c = *p;
		if ((c == '\0') || (c == '/') || (c == '#') || (c == '?')) {
			*p = '\0';
			memmove(url->u_buffer, s, strlen(s) + 1);
			*p = c;
			break;
		}
		p++;
	}

	s           = p;
	url->u_path = p;

	// shift the host back to the start of the buffer, which gives us
	// padding so we don't have to clobber the leading "/" in the path.
	url->u_hostname = url->u_buffer;

	char *at;
	if ((at = strchr(url->u_hostname, '@')) != NULL) {
		url->u_userinfo = url->u_hostname;
		*at++           = 0;
		url->u_hostname = at;

		// make sure only one '@' appears in the host (only one user
		// info is allowed)
		if (strchr(url->u_hostname, '@') != NULL) {
			return (NNG_EINVAL);
		}
	}

	// Copy the host portion, but make it lower case (hostnames are
	// case insensitive).
	for (int i = 0; url->u_hostname[i]; i++) {
		url->u_hostname[i] = (char) tolower(url->u_hostname[i]);
	}

	if ((rv = nni_url_canonify_uri(p)) != 0) {
		return (rv);
	}

	while ((c = *p) != '\0') {
		if ((c == '?') || (c == '#')) {
			break;
		}
		p++;
	}

	// Look for query info portion.
	if (*p == '?') {
		*p++         = '\0';
		url->u_query = p;
		while ((c = *p) != '\0') {
			if (c == '#') {
				*p++            = '\0';
				url->u_fragment = p;
				break;
			}
			p++;
		}
	} else if (c == '#') {
		*p++            = '\0';
		url->u_fragment = p;
	}

	// Now go back to the host portion, and look for a separate
	// port We also yank off the "[" part for IPv6 addresses.
	p = url->u_hostname;
	if (*p == '[') {
		url->u_hostname++;
		p++;
		while (*p != ']') {
			if (*p++ == '\0') {
				return (NNG_EINVAL);
			}
		}
		*p++ = '\0';
		if ((*p != ':') && (*p != '\0')) {
			return (NNG_EINVAL);
		}
	} else {
		while (*p != ':' && *p != '\0') {
			p++;
		}
	}
	if ((c = *p) == ':') {
		*p++ = '\0';
	}
	// hostname length check
	if (strlen(url->u_hostname) >= 256) {
		return (NNG_EINVAL);
	}

	if (c == ':') {
		// If a colon was present, but no port value present, then
		// that is an error.
		if (*p == '\0') {
			return (NNG_EINVAL);
		}
		if (nni_get_port_by_name(p, &url->u_port) != 0) {
			return (NNG_EINVAL);
		}
	} else {
		url->u_port = nni_url_default_port(url->u_scheme);
	}

	return (0);
}